

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReGlob.cpp
# Opt level: O2

string * SudoMaker::ReGlob::RegexpString
                   (string *__return_storage_ptr__,string *glob,config config,bool _is_path)

{
  byte bVar1;
  uchar uVar2;
  char cVar3;
  ulong uVar4;
  pointer pcVar5;
  char cVar6;
  reglob_error *prVar7;
  undefined7 in_register_00000009;
  pointer puVar8;
  pointer puVar9;
  pointer puVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  char *__s;
  bool bVar16;
  uint local_128;
  allocator<char> local_11d;
  undefined4 local_11c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> domain;
  string error_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  char *local_c0;
  ulong local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_11c = (undefined4)CONCAT71(in_register_00000009,_is_path);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  error_msg._M_dataplus._M_p._0_1_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&domain,1,(value_type_conflict3 *)&error_msg,(allocator_type *)&local_e0);
  uVar4 = glob->_M_string_length;
  local_b8 = (ulong)(uint5)config & 0x100000100;
  local_c0 = "\\?";
  if (((uint5)config & 0x100) != 0) {
    local_c0 = "(.)";
  }
  uVar12 = 0;
  bVar16 = false;
  do {
    local_128 = config._0_4_;
    if (uVar4 <= uVar12) {
      if (bVar16 != false) {
        prVar7 = (reglob_error *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,"ReGlob: Escape at the end of line.",
                   (allocator<char> *)&error_msg);
        reglob_error::reglob_error(prVar7,&local_70);
        __cxa_throw(prVar7,&reglob_error::typeinfo,reglob_error::~reglob_error);
      }
      if (domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish[-1] == '\0') {
        if ((local_128 >> 0x10 & 1) != 0) {
          std::operator+(&local_e0,"^",__return_storage_ptr__);
          std::operator+(&error_msg,&local_e0,"$");
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&error_msg);
          std::__cxx11::string::~string((string *)&error_msg);
          std::__cxx11::string::~string((string *)&local_e0);
        }
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        return __return_storage_ptr__;
      }
      __s = "}";
      if (domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish[-1] == '\x01') {
        __s = "]";
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,__s,&local_11d);
      std::operator+(&local_e0,"ReGlob: unmatched ",&local_b0);
      std::operator+(&error_msg,&local_e0," in glob expression");
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_b0);
      prVar7 = (reglob_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&local_90,(string *)&error_msg);
      reglob_error::reglob_error(prVar7,&local_90);
      __cxa_throw(prVar7,&reglob_error::typeinfo,reglob_error::~reglob_error);
    }
    pcVar5 = (glob->_M_dataplus)._M_p;
    bVar1 = pcVar5[uVar12];
    uVar2 = domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish[-1];
    cVar6 = (char)__return_storage_ptr__;
    switch(bVar1) {
    case 0x5b:
      if (bVar16 == false) {
        if ((local_128 >> 8 & 1) == 0) {
          std::__cxx11::string::push_back(cVar6);
        }
        else if (((uint5)config & 0x100000000) != 0) {
          lVar11 = (long)domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start;
          puVar8 = domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start + 1;
          for (lVar14 = lVar11 >> 2; 0 < lVar14; lVar14 = lVar14 + -1) {
            if (puVar8[-1] == '\x01') {
              puVar8 = puVar8 + -1;
              goto LAB_00107433;
            }
            if (*puVar8 == '\x01') goto LAB_00107433;
            if (puVar8[1] == '\x01') {
              puVar8 = puVar8 + 1;
              goto LAB_00107433;
            }
            if (puVar8[2] == '\x01') {
              puVar8 = puVar8 + 2;
              goto LAB_00107433;
            }
            puVar8 = puVar8 + 4;
            lVar11 = lVar11 + -4;
          }
          puVar10 = puVar8 + -1;
          if (lVar11 == 1) {
LAB_00107470:
            puVar8 = puVar10;
            if (*puVar10 != '\x01') {
              puVar8 = domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            }
LAB_00107433:
            if (puVar8 != domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish) {
              prVar7 = (reglob_error *)__cxa_allocate_exception(0x28);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_50,
                         "ReGlob: Cannot group square bracket inside square brackets.",
                         (allocator<char> *)&error_msg);
              reglob_error::reglob_error(prVar7,&local_50);
              __cxa_throw(prVar7,&reglob_error::typeinfo,reglob_error::~reglob_error);
            }
          }
          else {
            if (lVar11 == 3) {
              puVar9 = puVar8;
              puVar8 = puVar10;
              if (*puVar10 != '\x01') goto LAB_00107465;
              goto LAB_00107433;
            }
            puVar9 = puVar10;
            if (lVar11 == 2) {
LAB_00107465:
              puVar8 = puVar9;
              if (*puVar9 != '\x01') {
                puVar10 = puVar9 + 1;
                goto LAB_00107470;
              }
              goto LAB_00107433;
            }
          }
          std::__cxx11::string::push_back(cVar6);
          error_msg._M_dataplus._M_p._0_1_ = 1;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (&domain,(uchar *)&error_msg);
        }
      }
      goto LAB_00107173;
    case 0x5c:
      if (bVar16 != false) goto LAB_001072f6;
      bVar16 = true;
      break;
    case 0x5d:
      if (bVar16 != false) goto LAB_00107173;
      if ((local_128 >> 8 & 1) != 0) {
        if (((uint5)config & 0x100000000) == 0) goto LAB_00107173;
        if (uVar2 == '\x01') {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish =
               domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish + -1;
          goto LAB_0010717f;
        }
      }
LAB_001072f6:
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      goto LAB_0010717f;
    default:
      if (((1 < bVar1 - 0x28) && (bVar1 != 0x21)) && (bVar1 != 0x24)) {
        if (bVar1 == 0x2a) {
          if (((~bVar16 | (byte)local_11c) & 1) == 0) goto LAB_00107173;
          if (uVar12 == 0) {
LAB_001071ed:
            cVar6 = '\0';
          }
          else {
            cVar6 = pcVar5[uVar12 - 1];
            if (((byte)local_11c & bVar16 & cVar6 != '\0') == 1) {
              if (uVar12 == 1) goto LAB_001071ed;
              cVar6 = pcVar5[uVar12 - 2];
            }
          }
          uVar15 = 0;
          do {
            uVar13 = uVar12;
            cVar3 = pcVar5[uVar13 + 1];
            uVar12 = uVar13 + 1;
            uVar15 = uVar15 + 1;
          } while (cVar3 == '*');
          if (((((local_128 >> 0x18 & 1) == 0) || (uVar15 < 2)) ||
              ((cVar6 != '/' && (cVar6 != '\0')))) || ((cVar3 != '/' && (cVar3 != '\0')))) {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            uVar12 = uVar13;
          }
          else {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          goto LAB_0010717f;
        }
        if (bVar1 != 0x2b) {
          if (bVar1 == 0x2c) {
            if ((bVar16 != false) || (uVar2 == '\0')) goto LAB_001072f6;
            if ((uVar2 != '\x02') && (uVar2 != '\x01')) goto LAB_0010717f;
          }
          else {
            if ((bVar1 == 0x2e) || (bVar1 == 0x3d)) goto switchD_001070e4_caseD_5e;
            if (bVar1 == 0x3f) {
              if ((bVar16 == false) && (local_b8 != 0x100)) goto LAB_001072f6;
            }
            else if (bVar1 == 0x7b) {
              if (bVar16 == false) {
                if ((local_128 >> 8 & 1) != 0) {
                  error_msg._M_dataplus._M_p._0_1_ = 2;
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                  emplace_back<unsigned_char>(&domain,(uchar *)&error_msg);
                  std::__cxx11::string::push_back(cVar6);
                  if (((uint5)config & 0x100000000) != 0) break;
LAB_00107246:
                  std::__cxx11::string::append((char *)__return_storage_ptr__);
                  break;
                }
                std::__cxx11::string::push_back(cVar6);
              }
            }
            else {
              if (bVar1 == 0x7c) goto switchD_001070e4_caseD_5e;
              if ((bVar1 == 0x7d) && (!bVar16)) {
                if ((uVar2 == '\x02' & config.bash_syntax & 1U) == 1) {
                  domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       domain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish + -1;
                  goto LAB_00107246;
                }
                std::__cxx11::string::push_back(cVar6);
              }
            }
          }
          goto LAB_00107173;
        }
      }
    case 0x5e:
switchD_001070e4_caseD_5e:
      if (bVar16 == false) {
        std::__cxx11::string::push_back(cVar6);
      }
LAB_00107173:
      std::__cxx11::string::push_back(cVar6);
LAB_0010717f:
      bVar16 = false;
    }
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

std::string ReGlob::RegexpString(const std::string &glob, ReGlob::config config, bool _is_path) {
	enum domains {
		DOMAIN_NONE = 0, DOMAIN_SQUARE_BRACKET = 1, DOMAIN_BRACES = 2
	};

	std::string regexp_str;

	bool escaped = false;

	std::vector<uint8_t> domain(1, DOMAIN_NONE);

	char c;
	uint8_t current_domain;
	for (size_t i = 0, len = glob.size(); i < len; i++) {
		c = glob[i];

		current_domain = domain.back();

		switch (c) {
			case '\\':
				if (escaped) {
					escaped = false;
					regexp_str += "\\\\";
				} else {
					escaped = true;
				}
				break;
			case '$':
			case '^':
			case '+':
			case '.':
			case '(':
			case ')':
			case '=':
			case '!':
			case '|':
				if (!escaped) {
					regexp_str += '\\';
				}
				regexp_str += c;
				escaped = false;
				break;
			case '?':
				if (escaped) {
					regexp_str += c;
				} else {
					if (config.bash_syntax) {
						if (config.capture) {
							regexp_str += "(.)";
						} else {
							regexp_str += '.';
						}
					} else {
						regexp_str += "\\?";
					}
				}
				escaped = false;
				break;

			case '[':
				if (!escaped) {
					if (config.bash_syntax) {
						if (config.capture) {
							if (std::find(domain.begin(), domain.end(), DOMAIN_SQUARE_BRACKET) != domain.end()) {
								throw reglob_error("ReGlob: Cannot group square bracket inside square brackets.");
							}
							regexp_str += '(';
							domain.push_back(DOMAIN_SQUARE_BRACKET);
						}
					} else {
						regexp_str += '\\';
					}
				}
				regexp_str += c;
				escaped = false;
				break;

			case ']':
				if (escaped) {
					regexp_str += c;
				} else {
					if (config.bash_syntax) {
						if (config.capture) {
							if (current_domain == DOMAIN_SQUARE_BRACKET) {
								regexp_str += "])";
								domain.pop_back();
							} else {
								regexp_str += "\\]";
							}
						} else {
							regexp_str += c;
						}
					} else {
						regexp_str += "\\]";
					}
				}
				escaped = false;
				break;

			case '{':
				if (!escaped) {
					if (config.bash_syntax) {
						domain.push_back(DOMAIN_BRACES);
						regexp_str += '(';
						if (!config.capture) {
							regexp_str += "?:";
						}
						break;
					} else {
						regexp_str += '\\';
					}
				}
				regexp_str += c;
				escaped = false;
				break;

			case '}':
				if (!escaped) {
					if (current_domain == DOMAIN_BRACES && config.bash_syntax) {
						domain.pop_back();
						regexp_str += ")";
						break;
					} else {
						regexp_str += '\\';
					}
				}
				regexp_str += c;
				escaped = false;
				break;

			case ',':
				if (!escaped && current_domain != DOMAIN_NONE) {
					if (current_domain == DOMAIN_BRACES) regexp_str += '|';
					else if (current_domain == DOMAIN_SQUARE_BRACKET) regexp_str += c;
				} else {
					regexp_str += "\\,";
				}
				escaped = false;
				break;

			case '*': {
				if (escaped && !_is_path) {
					regexp_str += c;
				} else {
					char prev_char = i ? glob[i - 1] : 0;
					if (prev_char && _is_path && escaped) {
						prev_char = i - 1 ? glob[i - 2] : 0;
					}

					size_t star_cnt = 1;
					while (glob[i + 1] == '*') {
						star_cnt++;
						i++;
					}
					char next_char = glob[i + 1];

					if (!config.globstars) {
						if (config.capture && !escaped) {
							regexp_str += "(.*)";
						} else {
							regexp_str += ".*";
						}
					} else {
						if (star_cnt > 1 && (prev_char == '/' || !prev_char) && (next_char == '/' || !next_char)) {
							if (config.capture && !escaped) {
								regexp_str += "((?:[^/]*(?:/|$))*)";
							} else {
								regexp_str += "(?:[^/]*(?:/|$))*";
							}
							i++;
						} else {
							if (config.capture && !escaped) {
								regexp_str += "([^/]*)";
							} else {
								regexp_str += "[^/]*";
							}
						}
					}
				}
				escaped = false;
				break;
			}
			default:
				regexp_str += c;
				escaped = false;
		}
	}

	current_domain = domain.back();

	if (escaped) {
		throw reglob_error("ReGlob: Escape at the end of line.");
	}
	if (current_domain != DOMAIN_NONE) {
//			printf("Current domain: %d\n", current_domain);
		std::string error_msg = "ReGlob: unmatched " + std::string(current_domain == DOMAIN_SQUARE_BRACKET ? "]" : "}") + " in glob expression";
		throw reglob_error(error_msg);
	}

	if (config.full_match) {
		regexp_str = "^" + regexp_str + "$";
	}

	return regexp_str;
}